

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeInlineString(WasmBinaryWriter *this,string_view name)

{
  BufferWithRandomAccess::operator<<(this->o,(U32LEB)(uint)name._M_len);
  writeData(this,name._M_str,name._M_len);
  return;
}

Assistant:

void WasmBinaryWriter::writeInlineString(std::string_view name) {
  o << U32LEB(name.size());
  writeData(name.data(), name.size());
}